

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O0

void __thiscall
QList<std::pair<QByteArray,_QByteArray>_>::pop_back(QList<std::pair<QByteArray,_QByteArray>_> *this)

{
  removeLast(this);
  return;
}

Assistant:

void pop_back() noexcept { removeLast(); }